

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall ldc::address(ldc *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  error *tmpres___LINE__;
  uint64_t value;
  token local_50;
  
  iVar1 = equal(token,"c");
  if (iVar1 == 0) {
    fail((token *)this,(char *)token,"expected constant buffer");
  }
  else {
    context::tokenize(&local_50,ctx);
    token->column = local_50.column;
    (token->data).string._M_str = local_50.data.string._M_str;
    token->type = local_50.type;
    token->line = local_50.line;
    token->filename = local_50.filename;
    (token->data).predicate = local_50.data.predicate;
    confirm_type((token *)this,(token_type)token);
    if (*(long *)this == 0) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
      context::tokenize(&local_50,ctx);
      token->column = local_50.column;
      (token->data).string._M_str = local_50.data.string._M_str;
      token->type = local_50.type;
      token->line = local_50.line;
      token->filename = local_50.filename;
      (token->data).predicate = local_50.data.predicate;
      convert_integer((token *)this,(int64_t)token,0,(uint64_t *)0x1f);
      if (*(long *)this == 0) {
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
        opcode::add_bits(op,value << 0x24);
        context::tokenize(&local_50,ctx);
        token->column = local_50.column;
        (token->data).string._M_str = local_50.data.string._M_str;
        token->type = local_50.type;
        token->line = local_50.line;
        token->filename = local_50.filename;
        (token->data).predicate = local_50.data.predicate;
        confirm_type((token *)this,(token_type)token);
        if (*(long *)this == 0) {
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
          context::tokenize(&local_50,ctx);
          token->column = local_50.column;
          (token->data).string._M_str = local_50.data.string._M_str;
          token->type = local_50.type;
          token->line = local_50.line;
          token->filename = local_50.filename;
          (token->data).predicate = local_50.data.predicate;
          memory::address<true,20,16,0>((memory *)this,ctx,token,op);
        }
      }
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        if (!equal(token, "c")) {
            return fail(token, "expected constant buffer");
        }
        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint64_t value;
        CHECK(convert_integer(token, 0, max_bits(5), &value));
        op.add_bits(static_cast<uint64_t>(value) << 36);

        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_right));

        token = ctx.tokenize();
        return memory::address<true, 20, 16, 0>(ctx, token, op);
    }